

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

void __thiscall lzham::lzcompressor::state::state(state *this)

{
  long lVar1;
  quasi_adaptive_huffman_data_model *pqVar2;
  
  lVar1 = 0x1c;
  do {
    adaptive_bit_model::adaptive_bit_model
              ((adaptive_bit_model *)((long)(this->super_state_base).m_match_hist + lVar1 + -8));
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x61c);
  lVar1 = 0x61c;
  do {
    adaptive_bit_model::adaptive_bit_model
              ((adaptive_bit_model *)((long)(this->super_state_base).m_match_hist + lVar1 + -8));
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x634);
  lVar1 = 0x634;
  do {
    adaptive_bit_model::adaptive_bit_model
              ((adaptive_bit_model *)((long)(this->super_state_base).m_match_hist + lVar1 + -8));
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x64c);
  lVar1 = 0x64c;
  do {
    adaptive_bit_model::adaptive_bit_model
              ((adaptive_bit_model *)((long)(this->super_state_base).m_match_hist + lVar1 + -8));
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x664);
  lVar1 = 0x664;
  do {
    adaptive_bit_model::adaptive_bit_model
              ((adaptive_bit_model *)((long)(this->super_state_base).m_match_hist + lVar1 + -8));
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x67c);
  lVar1 = 0x67c;
  do {
    adaptive_bit_model::adaptive_bit_model
              ((adaptive_bit_model *)((long)(this->super_state_base).m_match_hist + lVar1 + -8));
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x694);
  pqVar2 = this->m_lit_table;
  lVar1 = 0;
  do {
    quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model(pqVar2);
    lVar1 = lVar1 + -0x80;
    pqVar2 = pqVar2 + 1;
  } while (lVar1 != -0x2000);
  pqVar2 = this->m_delta_lit_table;
  lVar1 = 0;
  do {
    quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model(pqVar2);
    lVar1 = lVar1 + -0x80;
    pqVar2 = pqVar2 + 1;
  } while (lVar1 != -0x2000);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model(&this->m_main_table);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model(this->m_rep_len_table);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model(this->m_rep_len_table + 1);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model(this->m_large_len_table);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model(this->m_large_len_table + 1);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model(&this->m_dist_lsb_table);
  clear(this);
  return;
}

Assistant:

lzcompressor::state::state()
   {
      clear();
   }